

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void __thiscall LogImpl::init_stream(LogImpl *this,string *name)

{
  char *pcVar1;
  const_iterator cVar2;
  size_t sVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
  __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  strmap;
  allocator_type local_d2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  local_a0;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined4 local_58;
  long *local_50 [2];
  long local_40 [2];
  undefined4 local_30;
  
  local_a0.first._M_dataplus._M_p = (pointer)&local_a0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"none","");
  local_a0.second = None;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"stdout","");
  local_58 = 0;
  plVar5 = local_40;
  local_50[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"stderr","");
  local_30 = 1;
  __l._M_len = 3;
  __l._M_array = &local_a0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
         *)&local_d0,__l,&local_d1,&local_d2);
  lVar6 = -0x78;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
          ::find(&local_d0,name);
  if ((_Rb_tree_header *)cVar2._M_node == &local_d0._M_impl.super__Rb_tree_header) {
    this->m_stream = File;
    std::ofstream::open((string *)&this->m_ofstream,(_Ios_Openmode)name);
    pcVar1 = s_prefix;
    if ((((&this->field_0x38)[*(long *)(*(long *)&this->m_ofstream + -0x18)] & 5) != 0) &&
       (0 < this->m_verbosity)) {
      if (s_prefix == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x285628);
      }
      else {
        sVar3 = strlen(s_prefix);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not open log file ",0x18);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  else {
    this->m_stream = cVar2._M_node[2]._M_color;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  ::~_Rb_tree(&local_d0);
  return;
}

Assistant:

void init_stream(const std::string& name)
    {
        const std::map<std::string, Stream> strmap { { "none", Stream::None },
                                           { "stdout", Stream::StdOut },
                                           { "stderr", Stream::StdErr } };

        auto it = strmap.find(name);

        if (it == strmap.end()) {
            m_stream = Stream::File;

            m_ofstream.open(name);

            if (!m_ofstream && m_verbosity > 0)
                std::cerr << s_prefix << "Could not open log file " << name << std::endl;
        } else
            m_stream = it->second;
    }